

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

int __thiscall smf::MidiEventList::linkNotePairs(MidiEventList *this)

{
  vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *this_00;
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  iterator __position;
  pointer pvVar4;
  MidiEvent *this_01;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer ppMVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  MidiEvent *mev;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> contmap;
  MidiEvent *local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  local_88;
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  local_68;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  local_68.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize(&local_68,0x10);
  if (0 < (int)((ulong)((long)local_68.
                              super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      std::
      vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
      ::resize((vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                *)((long)&((local_68.
                            super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12),0x80);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar13 < (int)((ulong)((long)local_68.
                                          super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&local_48,0x80);
  ppVar5 = local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    memset(local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start,0,
           ((long)local_48.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
            (-8 - (long)local_48.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
  }
  ppVar5[0x40].first = 1;
  ppVar5[0x40].second = 0;
  ppVar5[0x41].first = 1;
  ppVar5[0x41].second = 1;
  ppVar5[0x42].first = 1;
  ppVar5[0x42].second = 2;
  ppVar5[0x43].first = 1;
  ppVar5[0x43].second = 3;
  ppVar5[0x44].first = 1;
  ppVar5[0x44].second = 4;
  ppVar5[0x45].first = 1;
  ppVar5[0x45].second = 5;
  ppVar5[0x50].first = 1;
  ppVar5[0x50].second = 6;
  ppVar5[0x51].first = 1;
  ppVar5[0x51].second = 7;
  ppVar5[0x52].first = 1;
  ppVar5[0x52].second = 8;
  ppVar5[0x53].first = 1;
  ppVar5[0x53].second = 9;
  ppVar5[0x54].first = 1;
  ppVar5[0x54].second = 10;
  ppVar5[0x55].first = 1;
  ppVar5[0x55].second = 0xb;
  ppVar5[0x56].first = 1;
  ppVar5[0x56].second = 0xc;
  ppVar5[0x57].first = 1;
  ppVar5[0x57].second = 0xd;
  ppVar5[0x58].first = 1;
  ppVar5[0x58].second = 0xe;
  ppVar5[0x59].first = 1;
  ppVar5[0x59].second = 0xf;
  ppVar5[0x5a].first = 1;
  ppVar5[0x5a].second = 0x10;
  ppVar5[0x7a].first = 1;
  ppVar5[0x7a].second = 0x11;
  local_88.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::resize(&local_88,0x12);
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&local_a8,0x12);
  lVar12 = 0;
  do {
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)
               ((long)&((local_88.
                         super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar12),0x10);
    pvVar2 = *(void **)((long)&((local_88.
                                 super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar12);
    pvVar3 = *(void **)((long)&((local_88.
                                 super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar12);
    if (pvVar2 != pvVar3) {
      memset(pvVar2,0,(long)pvVar3 - (long)pvVar2 & 0xfffffffffffffff8);
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&((local_a8.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar12),0x10);
    pvVar2 = *(void **)((long)&((local_a8.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar12);
    pvVar3 = *(void **)((long)&((local_a8.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar12);
    if (pvVar2 != pvVar3) {
      memset(pvVar2,0xff,((long)pvVar3 + (-4 - (long)pvVar2) & 0xfffffffffffffffcU) + 4);
    }
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x1b0);
  ppMVar10 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->list).
                          super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar10) >> 3) < 1) {
    iVar11 = 0;
  }
  else {
    lVar12 = 0;
    iVar11 = 0;
    do {
      local_b0 = ppMVar10[lVar12];
      MidiEvent::unlinkEvent(local_b0);
      bVar6 = MidiMessage::isNoteOn(&local_b0->super_MidiMessage);
      if (bVar6) {
        iVar7 = MidiMessage::getKeyNumber(&local_b0->super_MidiMessage);
        iVar8 = MidiMessage::getChannel(&local_b0->super_MidiMessage);
        this_00 = (vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)
                  (local_68.
                   super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].
                   super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar7);
        __position._M_current = *(MidiEvent ***)(this_00 + 8);
        if (__position._M_current == *(MidiEvent ***)(this_00 + 0x10)) {
          std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
          _M_realloc_insert<smf::MidiEvent*const&>(this_00,__position,&local_b0);
        }
        else {
          *__position._M_current = local_b0;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      else {
        bVar6 = MidiMessage::isNoteOff(&local_b0->super_MidiMessage);
        if (bVar6) {
          iVar7 = MidiMessage::getKeyNumber(&local_b0->super_MidiMessage);
          iVar8 = MidiMessage::getChannel(&local_b0->super_MidiMessage);
          pvVar4 = local_68.
                   super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].
                   super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppMVar10 = *(pointer *)
                      ((long)&pvVar4[iVar7].
                              super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                              ._M_impl.super__Vector_impl_data + 8);
          if (ppMVar10 !=
              pvVar4[iVar7].super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            this_01 = ppMVar10[-1];
            *(pointer *)
             ((long)&pvVar4[iVar7].
                     super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
                     .super__Vector_impl_data + 8) = ppMVar10 + -1;
            MidiEvent::linkEvent(this_01,local_b0);
            iVar11 = iVar11 + 1;
          }
        }
        else {
          bVar6 = MidiMessage::isController(&local_b0->super_MidiMessage);
          if (bVar6) {
            iVar7 = MidiMessage::getP1(&local_b0->super_MidiMessage);
            if (local_48.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar7].first != 0) {
              iVar7 = local_48.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7].second;
              iVar8 = MidiMessage::getChannel(&local_b0->super_MidiMessage);
              iVar9 = MidiMessage::getP2(&local_b0->super_MidiMessage);
              uVar1 = local_a8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[iVar8];
              if ((iVar9 < 0x40) || (uVar1 != 0xffffffff)) {
                if (uVar1 != 0x3f < iVar9) {
                  if ((0x3f < iVar9) && (uVar1 == 0)) goto LAB_00118e8c;
                  if ((iVar9 < 0x40) && (uVar1 == 1)) {
                    MidiEvent::linkEvent
                              (local_88.
                               super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar7].
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8],local_b0);
                    local_a8.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar8] = (uint)(0x3f < iVar9);
                    local_88.
                    super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar8] = local_b0;
                  }
                }
              }
              else {
LAB_00118e8c:
                local_88.
                super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].
                super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8] = local_b0;
                local_a8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar8] = 1;
              }
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      ppMVar10 = (this->list).
                 super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(this->list).
                                          super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppMVar10) >> 3));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::~vector(&local_88);
  if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::~vector(&local_68);
  return iVar11;
}

Assistant:

int MidiEventList::linkNotePairs(void) {

	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs.
	std::vector<std::vector<std::vector<MidiEvent*>>> noteons;
	noteons.resize(16);
	int i;
	for (i=0; i<(int)noteons.size(); i++) {
		noteons[i].resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap;
	contmap.resize(128);
	std::pair<int, int> zero(0, 0);
	std::fill(contmap.begin(), contmap.end(), zero);
	contmap[64].first  = 1;   contmap[64].second = 0;
	contmap[65].first  = 1;   contmap[65].second = 1;
	contmap[66].first  = 1;   contmap[66].second = 2;
	contmap[67].first  = 1;   contmap[67].second = 3;
	contmap[68].first  = 1;   contmap[68].second = 4;
	contmap[69].first  = 1;   contmap[69].second = 5;
	contmap[80].first  = 1;   contmap[80].second = 6;
	contmap[81].first  = 1;   contmap[81].second = 7;
	contmap[82].first  = 1;   contmap[82].second = 8;
	contmap[83].first  = 1;   contmap[83].second = 9;
	contmap[84].first  = 1;   contmap[84].second = 10;
	contmap[85].first  = 1;   contmap[85].second = 11;
	contmap[86].first  = 1;   contmap[86].second = 12;
	contmap[87].first  = 1;   contmap[87].second = 13;
	contmap[88].first  = 1;   contmap[88].second = 14;
	contmap[89].first  = 1;   contmap[89].second = 15;
	contmap[90].first  = 1;   contmap[90].second = 16;
	contmap[122].first = 1;   contmap[122].second = 17;

	// dimensions:
	// 1: mapped controller (0 to 17)
	// 2: channel (0 to 15)
	std::vector<std::vector<MidiEvent*>> contevents;
	contevents.resize(18);
	std::vector<std::vector<int>> oldstates;
	oldstates.resize(18);
	for (int i=0; i<18; i++) {
		contevents[i].resize(16);
		std::fill(contevents[i].begin(), contevents[i].end(), nullptr);
		oldstates[i].resize(16);
		std::fill(oldstates[i].begin(), oldstates[i].end(), -1);
	}

	// Now iterate through the MidiEventList keeping track of note and
	// select controller states and linking notes/controllers as needed.
	int channel;
	int key;
	int contnum;
	int contval;
	int conti;
	int contstate;
	int counter = 0;
	MidiEvent* mev;
	MidiEvent* noteon;
	for (i=0; i<getSize(); i++) {
		mev = &getEvent(i);
		mev->unlinkEvent();
		if (mev->isNoteOn()) {
			// store the note-on to pair later with a note-off message.
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			noteons[channel][key].push_back(mev);
		} else if (mev->isNoteOff()) {
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			if (noteons[channel][key].size() > 0) {
				noteon = noteons[channel][key].back();
				noteons[channel][key].pop_back();
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			contnum = mev->getP1();
			if (contmap[contnum].first) {
				conti     = contmap[contnum].second;
				channel   = mev->getChannel();
				contval   = mev->getP2();
				contstate = contval < 64 ? 0 : 1;
				if ((oldstates[conti][channel] == -1) && contstate) {
					// a newly initialized onstate was detected, so store for
					// later linking to an off state.
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// the controller state is redundant and will be ignored.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					// controller is currently off, so store on-state for next link
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					// controller has just been turned off, so link to
					// stored on-message.
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					// not necessary, but maybe use for something later:
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}